

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int ns_parse_address(char *str,socket_address *sa,int *proto,int *use_ssl,char *cert,char *ca)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  int local_12c;
  char local_128 [8];
  char host [200];
  int local_54;
  int local_50;
  int len;
  int n;
  uint port;
  uint d;
  uint c;
  uint b;
  uint a;
  char *ca_local;
  char *cert_local;
  int *use_ssl_local;
  int *proto_local;
  socket_address *sa_local;
  char *str_local;
  
  local_50 = 0;
  local_54 = 0;
  _b = ca;
  ca_local = cert;
  cert_local = (char *)use_ssl;
  use_ssl_local = proto;
  proto_local = (int *)sa;
  sa_local = (socket_address *)str;
  memset(sa,0,0x10);
  *(undefined2 *)proto_local = 2;
  *use_ssl_local = 1;
  cert_local[0] = '\0';
  cert_local[1] = '\0';
  cert_local[2] = '\0';
  cert_local[3] = '\0';
  *_b = '\0';
  *ca_local = '\0';
  iVar2 = memcmp(sa_local,"ssl://",6);
  if (iVar2 == 0) {
    sa_local = (socket_address *)((sa_local->sa).sa_data + 4);
    cert_local[0] = '\x01';
    cert_local[1] = '\0';
    cert_local[2] = '\0';
    cert_local[3] = '\0';
  }
  else {
    iVar2 = memcmp(sa_local,"udp://",6);
    if (iVar2 == 0) {
      sa_local = (socket_address *)((sa_local->sa).sa_data + 4);
      *use_ssl_local = 2;
    }
    else {
      iVar2 = memcmp(sa_local,"tcp://",6);
      if (iVar2 == 0) {
        sa_local = (socket_address *)((sa_local->sa).sa_data + 4);
      }
    }
  }
  iVar2 = __isoc99_sscanf(sa_local,"%u.%u.%u.%u:%u%n",&c,&d,&port,&n,&len,&local_54);
  if (iVar2 == 5) {
    uVar3 = htonl(c << 0x18 | d << 0x10 | port << 8 | n);
    proto_local[1] = uVar3;
    uVar1 = htons((uint16_t)len);
    *(uint16_t *)((long)proto_local + 2) = uVar1;
  }
  else {
    iVar2 = __isoc99_sscanf(sa_local,"%199[^ :]:%u%n",local_128,&len,&local_54);
    if (iVar2 == 2) {
      uVar1 = htons((uint16_t)len);
      *(uint16_t *)((long)proto_local + 2) = uVar1;
      ns_resolve2(local_128,(in_addr *)(proto_local + 1));
    }
    else {
      iVar2 = __isoc99_sscanf(sa_local,"%u%n",&len,&local_54);
      if (iVar2 == 1) {
        uVar1 = htons((uint16_t)len);
        *(uint16_t *)((long)proto_local + 2) = uVar1;
      }
    }
  }
  if ((*(int *)cert_local != 0) &&
     ((iVar2 = __isoc99_sscanf((long)sa_local + (long)local_54,":%99[^:]:%99[^:]%n",ca_local,_b,
                               &local_50), iVar2 == 2 ||
      (iVar2 = __isoc99_sscanf((long)sa_local + (long)local_54,":%99[^:]%n",ca_local,&local_50),
      iVar2 == 1)))) {
    local_54 = local_50 + local_54;
  }
  if (((uint)len < 0xffff) && (*(char *)((long)sa_local + (long)local_54) == '\0')) {
    local_12c = local_54;
  }
  else {
    local_12c = 0;
  }
  return local_12c;
}

Assistant:

static int ns_parse_address(const char *str, union socket_address *sa,
                            int *proto, int *use_ssl, char *cert, char *ca) {
  unsigned int a, b, c, d, port;
  int n = 0, len = 0;
  char host[200];
#ifdef NS_ENABLE_IPV6
  char buf[100];
#endif

  // MacOS needs that. If we do not zero it, subsequent bind() will fail.
  // Also, all-zeroes in the socket address means binding to all addresses
  // for both IPv4 and IPv6 (INADDR_ANY and IN6ADDR_ANY_INIT).
  memset(sa, 0, sizeof(*sa));
  sa->sin.sin_family = AF_INET;

  *proto = SOCK_STREAM;
  *use_ssl = 0;
  cert[0] = ca[0] = '\0';

  if (memcmp(str, "ssl://", 6) == 0) {
    str += 6;
    *use_ssl = 1;
  } else if (memcmp(str, "udp://", 6) == 0) {
    str += 6;
    *proto = SOCK_DGRAM;
  } else if (memcmp(str, "tcp://", 6) == 0) {
    str += 6;
  }

  if (sscanf(str, "%u.%u.%u.%u:%u%n", &a, &b, &c, &d, &port, &len) == 5) {
    // Bind to a specific IPv4 address, e.g. 192.168.1.5:8080
    sa->sin.sin_addr.s_addr = htonl((a << 24) | (b << 16) | (c << 8) | d);
    sa->sin.sin_port = htons((uint16_t) port);
#ifdef NS_ENABLE_IPV6
  } else if (sscanf(str, "[%99[^]]]:%u%n", buf, &port, &len) == 2 &&
             inet_pton(AF_INET6, buf, &sa->sin6.sin6_addr)) {
    // IPv6 address, e.g. [3ffe:2a00:100:7031::1]:8080
    sa->sin6.sin6_family = AF_INET6;
    sa->sin6.sin6_port = htons((uint16_t) port);
#endif
  } else if (sscanf(str, "%199[^ :]:%u%n", host, &port, &len) == 2) {
    sa->sin.sin_port = htons((uint16_t) port);
    ns_resolve2(host, &sa->sin.sin_addr);
  } else if (sscanf(str, "%u%n", &port, &len) == 1) {
    // If only port is specified, bind to IPv4, INADDR_ANY
    sa->sin.sin_port = htons((uint16_t) port);
  }

  if (*use_ssl && (sscanf(str + len, ":%99[^:]:%99[^:]%n", cert, ca, &n) == 2 ||
                   sscanf(str + len, ":%99[^:]%n", cert, &n) == 1)) {
    len += n;
  }

  return port < 0xffff && str[len] == '\0' ? len : 0;
}